

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O1

void __thiscall
soul::AST::Processor::Processor
          (Processor *this,CodeLocation *processorKeyword,Context *processorName,
          Identifier moduleName)

{
  CodeLocation local_18;
  
  local_18.sourceCode.object = (processorKeyword->sourceCode).object;
  if (local_18.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_18.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_18.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_18.location.data = (processorKeyword->location).data;
  ProcessorBase::ProcessorBase
            (&this->super_ProcessorBase,Processor,&local_18,processorName,moduleName);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_18.sourceCode.object);
  (this->super_ProcessorBase).super_ModuleBase.super_ASTObject._vptr_ASTObject =
       (_func_int **)&PTR__Processor_002d58a8;
  (this->super_ProcessorBase).super_ModuleBase.super_Scope._vptr_Scope =
       (_func_int **)&PTR__Processor_002d5978;
  (this->latency).object = (Expression *)0x0;
  (this->functions).
  super__Vector_base<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->functions).
  super__Vector_base<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->functions).
  super__Vector_base<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->stateVariables).
  super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->stateVariables).
  super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->stateVariables).
  super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Processor (CodeLocation processorKeyword, const Context& processorName, Identifier moduleName)
            : ProcessorBase (ObjectType::Processor, processorKeyword, processorName, moduleName) {}